

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall rw::Geometry::generateTriangles(Geometry *this,int8 *adc)

{
  ushort uVar1;
  MeshHeader *pMVar2;
  long lVar3;
  int iVar4;
  int32 iVar5;
  uint32 j;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  int8 *piVar10;
  uint uVar11;
  int iVar12;
  MeshHeader *pMVar13;
  MeshHeader *pMVar14;
  long lVar15;
  Triangle *pTVar16;
  int8 *local_58;
  
  pMVar2 = this->meshHeader;
  this->numTriangles = 0;
  pMVar13 = pMVar2 + 1;
  uVar1 = pMVar2->numMeshes;
  iVar12 = 0;
  piVar10 = adc;
  pMVar14 = pMVar13;
  for (uVar11 = 0; uVar7 = (uint)uVar1, uVar11 != uVar7; uVar11 = uVar11 + 1) {
    uVar7 = pMVar14->totalIndices;
    if (2 < (ulong)uVar7) {
      if (pMVar2->flags == 1) {
        pcVar9 = piVar10 + 2;
        for (lVar15 = 0; (ulong)(uVar7 - 2) * 2 != lVar15; lVar15 = lVar15 + 2) {
          if (((adc == (int8 *)0x0) || (*pcVar9 == '\0')) &&
             (iVar4 = isDegenerate((uint16 *)(*(long *)pMVar14 + lVar15)), iVar4 == 0)) {
            iVar12 = iVar12 + 1;
            this->numTriangles = iVar12;
          }
          pcVar9 = pcVar9 + 1;
        }
      }
      else {
        iVar12 = iVar12 + uVar7 / 3;
        this->numTriangles = iVar12;
      }
    }
    pMVar14 = (MeshHeader *)&pMVar14[1].totalIndices;
    piVar10 = piVar10 + uVar7;
  }
  pTVar16 = this->triangles;
  local_58 = adc;
  for (uVar11 = 0; uVar11 < uVar7; uVar11 = uVar11 + 1) {
    uVar7 = pMVar13->totalIndices;
    if (2 < (ulong)uVar7) {
      iVar5 = MaterialList::findIndex(&this->matList,*(Material **)(pMVar13 + 1));
      if (pMVar2->flags == 1) {
        lVar15 = 0;
        for (uVar8 = 0; uVar7 - 2 != uVar8; uVar8 = uVar8 + 1) {
          if ((adc == (int8 *)0x0) || (local_58[uVar8 + 2] == '\0')) {
            lVar3 = *(long *)pMVar13;
            iVar12 = isDegenerate((uint16 *)(lVar3 + lVar15));
            if (iVar12 == 0) {
              uVar6 = (uint)uVar8;
              pTVar16->v[0] = *(uint16 *)(lVar3 + uVar8 * 2);
              pTVar16->v[1] = *(uint16 *)(lVar3 + (ulong)((uVar6 & 1) + 1 + uVar6) * 2);
              pTVar16->v[2] = *(uint16 *)(lVar3 + (ulong)(uVar6 + 2 & 0xfffffffe) * 2);
              pTVar16->matId = (uint16)iVar5;
              pTVar16 = pTVar16 + 1;
            }
          }
          lVar15 = lVar15 + 2;
        }
      }
      else {
        for (uVar6 = 0; uVar6 < uVar7 - 2; uVar6 = uVar6 + 3) {
          lVar15 = *(long *)pMVar13;
          pTVar16->v[0] = *(uint16 *)(lVar15 + (ulong)uVar6 * 2);
          pTVar16->v[1] = *(uint16 *)(lVar15 + (ulong)(uVar6 + 1) * 2);
          pTVar16->v[2] = *(uint16 *)(lVar15 + (ulong)(uVar6 + 2) * 2);
          pTVar16->matId = (uint16)iVar5;
          pTVar16 = pTVar16 + 1;
        }
      }
    }
    pMVar13 = (MeshHeader *)&pMVar13[1].totalIndices;
    local_58 = local_58 + uVar7;
    uVar7 = (uint)pMVar2->numMeshes;
  }
  return;
}

Assistant:

void
Geometry::generateTriangles(int8 *adc)
{
	MeshHeader *header = this->meshHeader;
	assert(header != nil);

	this->numTriangles = 0;
	Mesh *m = header->getMeshes();
	int8 *adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			// shouldn't happen but it does
			adcbits += m->numIndices;
			m++;
			continue;
		}
		if(header->flags == MeshHeader::TRISTRIP){
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if(!(adc && adcbits[j+2]) &&
				   !isDegenerate(&m->indices[j]))
					this->numTriangles++;
			}
		}else
			this->numTriangles += m->numIndices/3;
		adcbits += m->numIndices;
		m++;
	}

	Triangle *tri = this->triangles;
	m = header->getMeshes();
	adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			adcbits += m->numIndices;
			m++;
			continue;
		}
		int32 matid = this->matList.findIndex(m->material);
		if(header->flags == MeshHeader::TRISTRIP)
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if((adc && adcbits[j+2]) ||
				   isDegenerate(&m->indices[j]))
					continue;
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1 + (j%2)];
				tri->v[2] = m->indices[j+2 - (j%2)];
				tri->matId = matid;
				tri++;
			}
		else
			for(uint32 j = 0; j < m->numIndices-2; j+=3){
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1];
				tri->v[2] = m->indices[j+2];
				tri->matId = matid;
				tri++;
			}
		adcbits += m->numIndices;
		m++;
	}
}